

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zCrcOpt.c
# Opt level: O1

UInt32 CrcUpdateT8(UInt32 v,void *data,size_t size,UInt32 *table)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  uint uVar5;
  
  if (((ulong)data & 7) != 0 && size != 0) {
    uVar3 = (long)data + 1;
    sVar4 = size;
    do {
      v = v >> 8 ^ table[(byte)((byte)*data ^ (byte)v)];
      size = sVar4 - 1;
      data = (void *)((long)data + 1);
      if (sVar4 == 1) break;
      uVar2 = uVar3 & 7;
      uVar3 = uVar3 + 1;
      sVar4 = size;
    } while (uVar2 != 0);
  }
  for (; 7 < size; size = size - 8) {
    uVar5 = v ^ *data;
    uVar1 = *(uint *)((long)data + 4);
    v = *(uint *)((long)table + (ulong)(uVar5 >> 6 & 0x3fc) + 0x1800) ^
        table[(ulong)(uVar5 & 0xff) + 0x700] ^
        *(uint *)((long)table + (ulong)(uVar5 >> 0xe & 0x3fc) + 0x1400) ^
        *(uint *)((long)table + (ulong)(uVar5 >> 0x16 & 0xfffffffc) + 0x1000) ^
        table[(ulong)(uVar1 & 0xff) + 0x300] ^
        *(uint *)((long)table + (ulong)(uVar1 >> 6 & 0x3fc) + 0x800) ^
        *(uint *)((long)table + (ulong)(uVar1 >> 0xe & 0x3fc) + 0x400) ^ table[uVar1 >> 0x18];
    data = (void *)((long)data + 8);
  }
  if (size != 0) {
    uVar3 = 0;
    do {
      v = v >> 8 ^ table[(byte)(*(byte *)((long)data + uVar3) ^ (byte)v)];
      uVar3 = uVar3 + 1;
    } while (size != uVar3);
  }
  return v;
}

Assistant:

UInt32 MY_FAST_CALL CrcUpdateT8(UInt32 v, const void *data, size_t size, const UInt32 *table)
{
  const Byte *p = (const Byte *)data;
  for (; size > 0 && ((unsigned)(ptrdiff_t)p & 7) != 0; size--, p++)
    v = CRC_UPDATE_BYTE_2(v, *p);
  for (; size >= 8; size -= 8, p += 8)
  {
    UInt32 d;
    v ^= *(const UInt32 *)p;
    v =
          table[0x700 + ((v      ) & 0xFF)]
        ^ table[0x600 + ((v >>  8) & 0xFF)]
        ^ table[0x500 + ((v >> 16) & 0xFF)]
        ^ table[0x400 + ((v >> 24))];
    d = *((const UInt32 *)p + 1);
    v ^=
          table[0x300 + ((d      ) & 0xFF)]
        ^ table[0x200 + ((d >>  8) & 0xFF)]
        ^ table[0x100 + ((d >> 16) & 0xFF)]
        ^ table[0x000 + ((d >> 24))];
  }
  for (; size > 0; size--, p++)
    v = CRC_UPDATE_BYTE_2(v, *p);
  return v;
}